

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O1

void cmListFileLexerSetToken(cmListFileLexer *lexer,char *text,int length)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = (lexer->token).text;
  iVar1 = lexer->column;
  (lexer->token).line = lexer->line;
  (lexer->token).column = iVar1;
  if (pcVar2 == (char *)0x0) {
LAB_004c5a85:
    if (text != (char *)0x0) {
      pcVar2 = strdup(text);
      (lexer->token).text = pcVar2;
      (lexer->token).length = length;
      length = length + 1;
      lVar3 = 0x30;
      goto LAB_004c5aaa;
    }
    length = 0;
  }
  else {
    if ((text == (char *)0x0) || (lexer->size <= length)) {
      free(pcVar2);
      (lexer->token).text = (char *)0x0;
      lexer->size = 0;
      goto LAB_004c5a85;
    }
    strcpy(pcVar2,text);
  }
  lVar3 = 0x10;
LAB_004c5aaa:
  *(int *)((long)&(lexer->token).type + lVar3) = length;
  return;
}

Assistant:

static void cmListFileLexerSetToken(cmListFileLexer* lexer, const char* text,
                                    int length)
{
  /* Set the token line and column number.  */
  lexer->token.line = lexer->line;
  lexer->token.column = lexer->column;

  /* Use the same buffer if possible.  */
  if (lexer->token.text) {
    if (text && length < lexer->size) {
      strcpy(lexer->token.text, text);
      lexer->token.length = length;
      return;
    }
    free(lexer->token.text);
    lexer->token.text = 0;
    lexer->size = 0;
  }

  /* Need to extend the buffer.  */
  if (text) {
    lexer->token.text = strdup(text);
    lexer->token.length = length;
    lexer->size = length + 1;
  } else {
    lexer->token.length = 0;
  }
}